

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::Format<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   LogicalType *params_1,LogicalType *params_2)

{
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  string *in_RDI;
  LogicalType *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  string local_48 [56];
  string *params_1_00;
  
  params_1_00 = in_RDI;
  ::std::__cxx11::string::string(local_48,(string *)in_RDX);
  LogicalType::LogicalType(in_RDX,in_R8);
  LogicalType::LogicalType(in_RDX,in_R8);
  Exception::ConstructMessage<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (in_stack_00000008,unaff_retaddr,(LogicalType *)params_1_00,in_RSI);
  LogicalType::~LogicalType((LogicalType *)0x1565d7c);
  LogicalType::~LogicalType((LogicalType *)0x1565d86);
  ::std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}